

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

char * StateToString(pyhanabi_state_t *state)

{
  char *pcVar1;
  long *in_RDI;
  string str;
  HanabiState *in_stack_00000218;
  string local_28 [40];
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1e4,"char *StateToString(pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    hanabi_learning_env::HanabiState::ToString_abi_cxx11_(in_stack_00000218);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pcVar1 = strdup(pcVar1);
    std::__cxx11::string::~string(local_28);
    return pcVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x1e5,"char *StateToString(pyhanabi_state_t *)");
}

Assistant:

char* StateToString(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  std::string str =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
          ->ToString();
  return strdup(str.c_str());
}